

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  float *pfVar2;
  float *pfVar3;
  undefined8 uVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  void *pvVar8;
  int y;
  int iVar9;
  int iVar10;
  uint _c;
  uint uVar11;
  int *piVar12;
  void *pvVar13;
  void *pvVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  void *pvVar20;
  uint _w;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  void *pvVar25;
  void *pvVar26;
  void *pvVar27;
  float *pfVar28;
  void *pvVar29;
  uint uVar30;
  float *rows1_old;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  undefined4 *puVar34;
  float fVar35;
  float fVar36;
  float *local_238;
  void *local_228;
  ulong local_210;
  Mat top_blob_c;
  Mat dst;
  Mat src;
  Mat dst_1;
  Mat rowsbuf1;
  Mat src_1;
  
  _c = bottom_blob->w;
  _w = this->output_width;
  iVar32 = this->output_height;
  if (bottom_blob->dims == 1) {
    uVar11 = 1;
    iVar5 = 1;
  }
  else {
    iVar5 = bottom_blob->h;
    uVar11 = _c;
    _c = bottom_blob->c;
  }
  local_210 = (ulong)_c;
  if (_w == 0 || iVar32 == 0) {
    iVar32 = (int)(this->height_scale * (float)iVar5);
    _w = (uint)(this->width_scale * (float)(int)uVar11);
  }
  if ((iVar32 == iVar5) && (_w == uVar11)) {
    Mat::operator=(top_blob,bottom_blob);
  }
  else {
    Mat::create(top_blob,_w,iVar32,_c,bottom_blob->elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (bottom_blob->dims == 1) {
      if ((int)_c < 1) {
        local_210 = 0;
      }
      for (uVar31 = 0; local_210 != uVar31; uVar31 = uVar31 + 1) {
        Mat::channel(&top_blob_c,top_blob,(int)uVar31);
        Mat::fill(&top_blob_c,*(float *)((long)bottom_blob->data + uVar31 * 4));
        Mat::~Mat(&top_blob_c);
      }
      return 0;
    }
    iVar10 = this->resize_type;
    if (iVar10 == 1) {
      if (this->output_height == 0) {
        fVar35 = 1.0 / this->height_scale;
      }
      else {
        fVar35 = (float)iVar5 / (float)this->output_height;
      }
      if (this->output_width == 0) {
        fVar36 = 1.0 / this->width_scale;
      }
      else {
        fVar36 = (float)(int)uVar11 / (float)this->output_width;
      }
      uVar33 = 0;
      uVar30 = 0;
      if (0 < (int)_w) {
        uVar30 = _w;
      }
      iVar10 = 0;
      if (0 < iVar32) {
        iVar10 = iVar32;
      }
      uVar16 = 0;
      if (0 < (int)_c) {
        uVar16 = _c;
      }
      for (; uVar33 != uVar16; uVar33 = uVar33 + 1) {
        Mat::channel(&top_blob_c,bottom_blob,uVar33);
        pvVar14 = top_blob_c.data;
        Mat::~Mat(&top_blob_c);
        Mat::channel(&top_blob_c,top_blob,uVar33);
        puVar34 = (undefined4 *)top_blob_c.data;
        Mat::~Mat(&top_blob_c);
        for (iVar9 = 0; iVar9 != iVar10; iVar9 = iVar9 + 1) {
          iVar17 = (int)((float)iVar9 * fVar35);
          if (iVar5 + -1 < (int)((float)iVar9 * fVar35)) {
            iVar17 = iVar5 + -1;
          }
          for (uVar21 = 0; uVar30 != uVar21; uVar21 = uVar21 + 1) {
            iVar24 = uVar11 - 1;
            if ((int)((float)(int)uVar21 * fVar36) <= (int)(uVar11 - 1)) {
              iVar24 = (int)((float)(int)uVar21 * fVar36);
            }
            *puVar34 = *(undefined4 *)((long)pvVar14 + (long)(int)(iVar24 + iVar17 * uVar11) * 4);
            puVar34 = puVar34 + 1;
          }
        }
      }
      iVar10 = this->resize_type;
    }
    lVar18 = (long)iVar32;
    if (iVar10 == 2) {
      iVar10 = _w * 3 + iVar32 * 3;
      uVar31 = (long)iVar10 * 4;
      if (iVar10 < 0) {
        uVar31 = 0xffffffffffffffff;
      }
      piVar12 = (int *)operator_new__(uVar31);
      piVar1 = piVar12 + (int)_w;
      pfVar2 = (float *)(piVar1 + lVar18);
      linear_coeffs(uVar11,_w,piVar12,pfVar2);
      linear_coeffs(iVar5,iVar32,piVar1,pfVar2 + (int)(_w * 2));
      uVar30 = 0;
      if (0 < (int)_c) {
        uVar30 = _c;
      }
      uVar33 = 0;
      while( true ) {
        if (uVar33 == uVar30) break;
        Mat::channel(&src,bottom_blob,uVar33);
        Mat::channel(&dst,top_blob,uVar33);
        uVar21 = dst.h;
        uVar16 = dst.w;
        Mat::Mat(&top_blob_c,dst.w,4,(Allocator *)0x0);
        Mat::Mat(&rowsbuf1,uVar16,4,(Allocator *)0x0);
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        if ((int)uVar21 < 1) {
          uVar21 = 0;
        }
        pvVar14 = top_blob_c.data;
        pvVar27 = dst.data;
        pfVar28 = pfVar2 + (int)(_w * 2);
        pvVar26 = rowsbuf1.data;
        iVar10 = -2;
        for (uVar31 = 0; uVar31 != uVar21; uVar31 = uVar31 + 1) {
          iVar9 = piVar1[uVar31];
          pvVar13 = pvVar14;
          pvVar20 = pvVar26;
          if (iVar9 != iVar10) {
            if (iVar9 == iVar10 + 1) {
              for (uVar22 = 0; pvVar13 = pvVar26, pvVar20 = pvVar14, uVar16 != uVar22;
                  uVar22 = uVar22 + 1) {
                uVar4 = *(undefined8 *)
                         ((long)src.data +
                         (long)piVar12[uVar22] * 4 + (long)((iVar9 + 1) * src.w) * src.elemsize);
                *(float *)((long)pvVar14 + uVar22 * 4) =
                     (float)((ulong)uVar4 >> 0x20) *
                     (float)((ulong)*(undefined8 *)(piVar12 + (long)(int)_w + lVar18 + uVar22 * 2)
                            >> 0x20) +
                     (float)uVar4 *
                     (float)*(undefined8 *)(piVar12 + (long)(int)_w + lVar18 + uVar22 * 2);
              }
            }
            else {
              for (uVar22 = 0; uVar16 != uVar22; uVar22 = uVar22 + 1) {
                iVar10 = piVar12[uVar22];
                uVar4 = *(undefined8 *)
                         ((long)src.data + (long)iVar10 * 4 + (long)(iVar9 * src.w) * src.elemsize);
                fVar35 = (float)*(undefined8 *)(piVar12 + (long)(int)_w + lVar18 + uVar22 * 2);
                fVar36 = (float)((ulong)*(undefined8 *)
                                         (piVar12 + (long)(int)_w + lVar18 + uVar22 * 2) >> 0x20);
                *(float *)((long)pvVar14 + uVar22 * 4) =
                     (float)((ulong)uVar4 >> 0x20) * fVar36 + (float)uVar4 * fVar35;
                uVar4 = *(undefined8 *)
                         ((long)src.data +
                         (long)iVar10 * 4 + (long)((iVar9 + 1) * src.w) * src.elemsize);
                *(float *)((long)pvVar26 + uVar22 * 4) =
                     (float)((ulong)uVar4 >> 0x20) * fVar36 + (float)uVar4 * fVar35;
              }
            }
          }
          uVar4 = *(undefined8 *)pfVar28;
          for (lVar19 = 0; uVar16 != (uint)lVar19; lVar19 = lVar19 + 1) {
            *(float *)((long)pvVar27 + lVar19 * 4) =
                 *(float *)((long)pvVar20 + lVar19 * 4) * (float)((ulong)uVar4 >> 0x20) +
                 *(float *)((long)pvVar13 + lVar19 * 4) * (float)uVar4;
          }
          pfVar28 = pfVar28 + 2;
          pvVar27 = (void *)((long)pvVar27 + (long)dst.w * dst.elemsize);
          pvVar14 = pvVar13;
          pvVar26 = pvVar20;
          iVar10 = iVar9;
        }
        Mat::~Mat(&rowsbuf1);
        Mat::~Mat(&top_blob_c);
        Mat::~Mat(&dst);
        Mat::~Mat(&src);
        uVar33 = uVar33 + 1;
      }
      operator_delete__(piVar12);
      iVar10 = this->resize_type;
    }
    if (iVar10 != 3) {
      return 0;
    }
    iVar10 = _w * 5 + iVar32 * 5;
    uVar31 = (long)iVar10 * 4;
    if (iVar10 < 0) {
      uVar31 = 0xffffffffffffffff;
    }
    piVar12 = (int *)operator_new__(uVar31);
    piVar1 = piVar12 + (int)_w;
    pfVar2 = (float *)(piVar1 + lVar18);
    cubic_coeffs(uVar11,_w,piVar12,pfVar2);
    cubic_coeffs(iVar5,iVar32,piVar1,pfVar2 + (int)(_w * 4));
    if ((int)_c < 1) {
      _c = 0;
    }
    uVar11 = 0;
    while( true ) {
      if (uVar11 == _c) break;
      Mat::channel(&src_1,bottom_blob,uVar11);
      Mat::channel(&dst_1,top_blob,uVar11);
      uVar33 = dst_1.h;
      uVar30 = dst_1.w;
      Mat::Mat(&top_blob_c,dst_1.w,4,(Allocator *)0x0);
      Mat::Mat(&rowsbuf1,uVar30,4,(Allocator *)0x0);
      Mat::Mat(&src,uVar30,4,(Allocator *)0x0);
      Mat::Mat(&dst,uVar30,4,(Allocator *)0x0);
      local_228 = dst.data;
      if ((int)uVar30 < 1) {
        uVar30 = 0;
      }
      if ((int)uVar33 < 1) {
        uVar33 = 0;
      }
      lVar19 = (ulong)uVar30 * 4;
      pvVar14 = src.data;
      pvVar27 = top_blob_c.data;
      pvVar26 = dst_1.data;
      pvVar13 = rowsbuf1.data;
      local_238 = pfVar2 + (int)(_w * 4);
      iVar32 = -3;
      for (uVar31 = 0; uVar31 != uVar33; uVar31 = uVar31 + 1) {
        iVar5 = piVar1[uVar31];
        pvVar20 = local_228;
        pvVar25 = pvVar27;
        pvVar8 = pvVar14;
        pvVar29 = pvVar13;
        if (iVar5 != iVar32) {
          if (iVar5 == iVar32 + 1) {
            for (lVar15 = 0; pvVar20 = pvVar27, pvVar25 = pvVar13, pvVar8 = local_228,
                pvVar29 = pvVar14, lVar19 - lVar15 != 0; lVar15 = lVar15 + 4) {
              pfVar28 = (float *)(piVar12 + (long)(int)_w + lVar18 + lVar15);
              pfVar3 = (float *)((long)src_1.data +
                                (long)*(int *)((long)piVar12 + lVar15) * 4 +
                                (long)((iVar5 + 2) * src_1.w) * src_1.elemsize + -4);
              *(float *)((long)pvVar27 + lVar15) =
                   pfVar3[3] * pfVar28[3] + pfVar3[1] * pfVar28[1] +
                   pfVar3[2] * pfVar28[2] + *pfVar3 * *pfVar28;
            }
          }
          else if (iVar5 == iVar32 + 2) {
            for (lVar15 = 0; pvVar20 = pvVar13, pvVar25 = pvVar14, pvVar8 = pvVar27,
                pvVar29 = local_228, lVar19 - lVar15 != 0; lVar15 = lVar15 + 4) {
              iVar32 = *(int *)((long)piVar12 + lVar15);
              pfVar28 = (float *)(piVar12 + (long)(int)_w + lVar18 + lVar15);
              fVar35 = *pfVar28;
              fVar36 = pfVar28[1];
              fVar6 = pfVar28[2];
              fVar7 = pfVar28[3];
              pfVar28 = (float *)((long)src_1.data +
                                 (long)iVar32 * 4 +
                                 (long)((iVar5 + 1) * src_1.w) * src_1.elemsize + -4);
              *(float *)((long)pvVar27 + lVar15) =
                   pfVar28[3] * fVar7 + pfVar28[1] * fVar36 + pfVar28[2] * fVar6 + *pfVar28 * fVar35
              ;
              pfVar28 = (float *)((long)src_1.data +
                                 (long)iVar32 * 4 +
                                 (long)((iVar5 + 2) * src_1.w) * src_1.elemsize + -4);
              *(float *)((long)pvVar13 + lVar15) =
                   pfVar28[3] * fVar7 + pfVar28[1] * fVar36 + pfVar28[2] * fVar6 + *pfVar28 * fVar35
              ;
            }
          }
          else if (iVar5 == iVar32 + 3) {
            for (lVar15 = 0; pvVar20 = pvVar14, pvVar25 = local_228, pvVar8 = pvVar13,
                pvVar29 = pvVar27, lVar19 - lVar15 != 0; lVar15 = lVar15 + 4) {
              lVar23 = (long)*(int *)((long)piVar12 + lVar15);
              pfVar28 = (float *)(piVar12 + (long)(int)_w + lVar18 + lVar15);
              fVar35 = *pfVar28;
              fVar36 = pfVar28[1];
              fVar6 = pfVar28[2];
              fVar7 = pfVar28[3];
              pfVar28 = (float *)((long)src_1.data +
                                 lVar23 * 4 + (long)(iVar5 * src_1.w) * src_1.elemsize + -4);
              *(float *)((long)pvVar27 + lVar15) =
                   pfVar28[3] * fVar7 + pfVar28[1] * fVar36 + pfVar28[2] * fVar6 + *pfVar28 * fVar35
              ;
              pfVar28 = (float *)((long)src_1.data +
                                 lVar23 * 4 + (long)((iVar5 + 1) * src_1.w) * src_1.elemsize + -4);
              *(float *)((long)pvVar13 + lVar15) =
                   pfVar28[3] * fVar7 + pfVar28[1] * fVar36 + pfVar28[2] * fVar6 + *pfVar28 * fVar35
              ;
              pfVar28 = (float *)((long)src_1.data +
                                 lVar23 * 4 + (long)((iVar5 + 2) * src_1.w) * src_1.elemsize + -4);
              *(float *)((long)pvVar14 + lVar15) =
                   pfVar28[3] * fVar7 + pfVar28[1] * fVar36 + pfVar28[2] * fVar6 + *pfVar28 * fVar35
              ;
            }
          }
          else {
            for (lVar15 = 0; lVar19 - lVar15 != 0; lVar15 = lVar15 + 4) {
              lVar23 = (long)*(int *)((long)piVar12 + lVar15);
              pfVar28 = (float *)(piVar12 + (long)(int)_w + lVar18 + lVar15);
              fVar35 = *pfVar28;
              fVar36 = pfVar28[1];
              fVar6 = pfVar28[2];
              fVar7 = pfVar28[3];
              pfVar28 = (float *)((long)src_1.data +
                                 lVar23 * 4 + (long)((iVar5 + -1) * src_1.w) * src_1.elemsize + -4);
              *(float *)((long)pvVar27 + lVar15) =
                   pfVar28[3] * fVar7 + pfVar28[1] * fVar36 + pfVar28[2] * fVar6 + *pfVar28 * fVar35
              ;
              pfVar28 = (float *)((long)src_1.data +
                                 lVar23 * 4 + (long)(iVar5 * src_1.w) * src_1.elemsize + -4);
              *(float *)((long)pvVar13 + lVar15) =
                   pfVar28[3] * fVar7 + pfVar28[1] * fVar36 + pfVar28[2] * fVar6 + *pfVar28 * fVar35
              ;
              pfVar28 = (float *)((long)src_1.data +
                                 lVar23 * 4 + (long)((iVar5 + 1) * src_1.w) * src_1.elemsize + -4);
              *(float *)((long)pvVar14 + lVar15) =
                   pfVar28[3] * fVar7 + pfVar28[1] * fVar36 + pfVar28[2] * fVar6 + *pfVar28 * fVar35
              ;
              pfVar28 = (float *)((long)src_1.data +
                                 lVar23 * 4 + (long)((iVar5 + 2) * src_1.w) * src_1.elemsize + -4);
              *(float *)((long)local_228 + lVar15) =
                   pfVar28[3] * fVar7 + pfVar28[1] * fVar36 + pfVar28[2] * fVar6 + *pfVar28 * fVar35
              ;
            }
          }
        }
        pvVar14 = pvVar8;
        fVar35 = *local_238;
        fVar36 = local_238[1];
        fVar6 = local_238[2];
        fVar7 = local_238[3];
        for (lVar15 = 0; uVar30 != (uint)lVar15; lVar15 = lVar15 + 1) {
          *(float *)((long)pvVar26 + lVar15 * 4) =
               *(float *)((long)pvVar20 + lVar15 * 4) * fVar7 +
               *(float *)((long)pvVar29 + lVar15 * 4) * fVar36 +
               *(float *)((long)pvVar14 + lVar15 * 4) * fVar6 +
               *(float *)((long)pvVar25 + lVar15 * 4) * fVar35;
        }
        local_238 = local_238 + 4;
        pvVar26 = (void *)((long)pvVar26 + (long)dst_1.w * dst_1.elemsize);
        pvVar27 = pvVar25;
        pvVar13 = pvVar29;
        local_228 = pvVar20;
        iVar32 = iVar5;
      }
      Mat::~Mat(&dst);
      Mat::~Mat(&src);
      Mat::~Mat(&rowsbuf1);
      Mat::~Mat(&top_blob_c);
      Mat::~Mat(&dst_1);
      Mat::~Mat(&src_1);
      uVar11 = uVar11 + 1;
    }
    operator_delete__(piVar12);
  }
  return 0;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outh = output_height;
    int outw = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        channels = bottom_blob.w;
    }
    if (outh == 0 || outw == 0)
    {
        outh = static_cast<int>(h * height_scale);
        outw = static_cast<int>(w * width_scale);
    }
    if (outh == h && outw == w)
    {
        top_blob = bottom_blob;
        return 0;
    }

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)// nearest
    {
        const float hs = output_height ? h / (float)output_height : 1.f / height_scale;
        const float ws = output_width ? w / (float)output_width : 1.f / width_scale;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            for (int y = 0; y < outh; y++)
            {
                int in_y = std::min((int) (y * hs), (h - 1));
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int) (x * ws), (w - 1));
                    *outptr++ = ptr[in_y * w + in_x];
                }
            }
        }
    }

    if (resize_type == 2)// bilinear
    {
        int* buf = new int[outw + outh + outw*2 + outh*2];

        int* xofs = buf;//new int[outw];
        int* yofs = buf + outw;//new int[outh];

        float* alpha = (float*)(buf + outw + outh);//new float[outw * 2];
        float* beta = (float*)(buf + outw + outh + outw*2);//new float[outh * 2];

        linear_coeffs(w, outw, xofs, alpha);
        linear_coeffs(h, outh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    if (resize_type == 3)// bicubic
    {
        int* buf = new int[outw + outh + outw*4 + outh*4];

        int* xofs = buf;//new int[outw];
        int* yofs = buf + outw;//new int[outh];

        float* alpha = (float*)(buf + outw + outh);//new float[outw * 4];
        float* beta = (float*)(buf + outw + outh + outw*4);//new float[outh * 4];

        cubic_coeffs(w, outw, xofs, alpha);
        cubic_coeffs(h, outh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    return 0;
}